

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Importer.cpp
# Opt level: O1

void __thiscall Assimp::Importer::SetProgressHandler(Importer *this,ProgressHandler *pHandler)

{
  ProgressHandler *pPVar1;
  
  if (pHandler == (ProgressHandler *)0x0) {
    pPVar1 = (ProgressHandler *)operator_new(8);
    pPVar1->_vptr_ProgressHandler = (_func_int **)&PTR__ProgressHandler_00258520;
    this->pimpl->mProgressHandler = pPVar1;
    this->pimpl->mIsDefaultProgressHandler = true;
  }
  else {
    pPVar1 = this->pimpl->mProgressHandler;
    if (pPVar1 != pHandler) {
      if (pPVar1 != (ProgressHandler *)0x0) {
        (*pPVar1->_vptr_ProgressHandler[1])();
      }
      this->pimpl->mProgressHandler = pHandler;
      this->pimpl->mIsDefaultProgressHandler = false;
    }
  }
  return;
}

Assistant:

void Importer::SetProgressHandler ( ProgressHandler* pHandler ) {
    ASSIMP_BEGIN_EXCEPTION_REGION();
    // If the new handler is zero, allocate a default implementation.
    if (!pHandler)
    {
        // Release pointer in the possession of the caller
        pimpl->mProgressHandler = new DefaultProgressHandler();
        pimpl->mIsDefaultProgressHandler = true;
    }
    // Otherwise register the custom handler
    else if (pimpl->mProgressHandler != pHandler)
    {
        delete pimpl->mProgressHandler;
        pimpl->mProgressHandler = pHandler;
        pimpl->mIsDefaultProgressHandler = false;
    }
    ASSIMP_END_EXCEPTION_REGION(void);
}